

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptSymbolObject * __thiscall
Js::JavascriptLibrary::CreateSymbolObject(JavascriptLibrary *this,JavascriptSymbol *value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptSymbolObject *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->symbolTypeDynamic).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1b7f,"(symbolTypeDynamic)","Where\'s symbolTypeDynamic?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&JavascriptSymbolObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x1b80;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (JavascriptSymbolObject *)new<Memory::Recycler>(0x28,alloc,0x38bbb2);
  JavascriptSymbolObject::JavascriptSymbolObject(this_00,value,(this->symbolTypeDynamic).ptr);
  return this_00;
}

Assistant:

JavascriptSymbolObject* JavascriptLibrary::CreateSymbolObject(JavascriptSymbol* value)
    {
        AssertMsg(symbolTypeDynamic, "Where's symbolTypeDynamic?");
        return RecyclerNew(this->GetRecycler(), JavascriptSymbolObject, value, symbolTypeDynamic);
    }